

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O2

void __thiscall cmServerBase::StartShutDown(cmServerBase *this)

{
  pointer puVar1;
  unique_ptr<cmConnection,_std::default_delete<cmConnection>_> *connection;
  pointer puVar2;
  unique_lock<cm::shared_mutex> lock;
  unique_lock<cm::shared_mutex> local_30;
  
  ::cm::uv_handle_ptr_base_<uv_async_s>::reset
            ((uv_handle_ptr_base_<uv_async_s> *)&this->ShutdownSignal);
  ::cm::uv_handle_ptr_base_<uv_signal_s>::reset
            ((uv_handle_ptr_base_<uv_signal_s> *)&this->SIGINTHandler);
  ::cm::uv_handle_ptr_base_<uv_signal_s>::reset
            ((uv_handle_ptr_base_<uv_signal_s> *)&this->SIGHUPHandler);
  std::unique_lock<cm::shared_mutex>::unique_lock(&local_30,&this->ConnectionsMutex);
  puVar1 = (this->Connections).
           super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (this->Connections).
                super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    (*((puVar2->_M_t).super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
       super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
       super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl)->_vptr_cmConnection[3])();
  }
  std::
  vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
  ::clear(&this->Connections);
  std::unique_lock<cm::shared_mutex>::~unique_lock(&local_30);
  uv_walk(&this->Loop,on_walk_to_shutdown,(void *)0x0);
  return;
}

Assistant:

void cmServerBase::StartShutDown()
{
  ShutdownSignal.reset();
  SIGINTHandler.reset();
  SIGHUPHandler.reset();

  {
    std::unique_lock<cm::shared_mutex> lock(ConnectionsMutex);
    for (auto& connection : Connections) {
      connection->OnConnectionShuttingDown();
    }
    Connections.clear();
  }

  uv_walk(&Loop, on_walk_to_shutdown, nullptr);
}